

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::OurReader::skipSpaces(OurReader *this)

{
  char cVar1;
  Char c;
  OurReader *this_local;
  
  while ((this->current_ != this->end_ &&
         ((((cVar1 = *this->current_, cVar1 == ' ' || (cVar1 == '\t')) || (cVar1 == '\r')) ||
          (cVar1 == '\n'))))) {
    this->current_ = this->current_ + 1;
  }
  return;
}

Assistant:

void OurReader::skipSpaces() {
  while (current_ != end_) {
    Char c = *current_;
    if (c == ' ' || c == '\t' || c == '\r' || c == '\n')
      ++current_;
    else
      break;
  }
}